

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_list3(sexp ctx,sexp a,sexp b,sexp c)

{
  sexp n;
  sexp psVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp head;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  psVar1 = (sexp)&stack0xffffffffffffffd8;
  head = *(sexp *)(in_RDI + 0x6080);
  *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffc8;
  n = sexp_list2((sexp)in_RSI,(sexp)in_RDX,(sexp)in_RCX);
  psVar1 = sexp_cons_op((sexp)in_RDX,(sexp)in_RCX,(sexp_sint_t)n,head,psVar1);
  *(sexp *)(in_RDI + 0x6080) = head;
  return psVar1;
}

Assistant:

sexp sexp_list3 (sexp ctx, sexp a, sexp b, sexp c) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_list2(ctx, b, c);
  res = sexp_cons(ctx, a, res);
  sexp_gc_release1(ctx);
  return res;
}